

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpc_test.cpp
# Opt level: O0

void __thiscall json_service::compiles2cr(json_service *this,string *f)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *this_00;
  ostringstream oss;
  char *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  string local_1b8 [48];
  ostringstream local_188 [392];
  
  bVar1 = std::operator==(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    poVar2 = std::operator<<((ostream *)local_188,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/jsonrpc_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x54);
    std::operator<<(poVar2," f==\"str\"");
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(this_00,local_1b8);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void compiles2cr(std::string const &f) {  TEST(f=="str"); }